

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O3

bool __thiscall reflection::Schema::Verify(Schema *this,Verifier *verifier)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *vec;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *vec_00;
  String *pSVar4;
  Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int> *vec_01;
  Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *vec_02;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    lVar2 = -(long)*(int *)this;
    if ((4 < *(ushort *)(this + -(long)*(int *)this)) &&
       (uVar3 = (ulong)*(ushort *)(this + lVar2 + 4), uVar3 != 0)) {
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                        (verifier,(uint8_t *)(this + *(uint *)(this + uVar3) + uVar3),4,
                         (size_t *)0x0);
      if (!bVar1) {
        return false;
      }
      lVar2 = -(long)*(int *)this;
    }
    if ((*(ushort *)(this + lVar2) < 5) ||
       (uVar3 = (ulong)*(ushort *)(this + lVar2 + 4), uVar3 == 0)) {
      vec = (Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *)0x0;
    }
    else {
      vec = (Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *)
            (this + *(uint *)(this + uVar3) + uVar3);
    }
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::Object>
                      (verifier,vec);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                          (&this->super_Table,verifier,6), bVar1)) {
      lVar2 = -(long)*(int *)this;
      if ((6 < *(ushort *)(this + -(long)*(int *)this)) &&
         (uVar3 = (ulong)*(ushort *)(this + lVar2 + 6), uVar3 != 0)) {
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                          (verifier,(uint8_t *)(this + *(uint *)(this + uVar3) + uVar3),4,
                           (size_t *)0x0);
        if (!bVar1) {
          return false;
        }
        lVar2 = -(long)*(int *)this;
      }
      if ((*(ushort *)(this + lVar2) < 7) ||
         (uVar3 = (ulong)*(ushort *)(this + lVar2 + 6), uVar3 == 0)) {
        vec_00 = (Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *)0x0;
      }
      else {
        vec_00 = (Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *)
                 (this + *(uint *)(this + uVar3) + uVar3);
      }
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::Enum>
                        (verifier,vec_00);
      if ((bVar1) &&
         (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,8),
         bVar1)) {
        if ((*(ushort *)(this + -(long)*(int *)this) < 9) ||
           (uVar3 = (ulong)*(ushort *)(this + (8 - (long)*(int *)this)), uVar3 == 0)) {
          pSVar4 = (String *)0x0;
        }
        else {
          pSVar4 = (String *)(this + *(uint *)(this + uVar3) + uVar3);
        }
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar4);
        if ((bVar1) &&
           (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,10),
           bVar1)) {
          if ((*(ushort *)(this + -(long)*(int *)this) < 0xb) ||
             (uVar3 = (ulong)*(ushort *)(this + (10 - (long)*(int *)this)), uVar3 == 0)) {
            pSVar4 = (String *)0x0;
          }
          else {
            pSVar4 = (String *)(this + *(uint *)(this + uVar3) + uVar3);
          }
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar4);
          if ((((bVar1) &&
               (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                  (&this->super_Table,verifier,0xc), bVar1)) &&
              ((*(ushort *)(this + -(long)*(int *)this) < 0xd ||
               ((uVar3 = (ulong)*(ushort *)(this + (0xc - (long)*(int *)this)), uVar3 == 0 ||
                (bVar1 = Object::Verify((Object *)(this + *(uint *)(this + uVar3) + uVar3),verifier)
                , bVar1)))))) &&
             (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                (&this->super_Table,verifier,0xe), bVar1)) {
            lVar2 = -(long)*(int *)this;
            if ((0xe < *(ushort *)(this + -(long)*(int *)this)) &&
               (uVar3 = (ulong)*(ushort *)(this + lVar2 + 0xe), uVar3 != 0)) {
              bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                (verifier,(uint8_t *)(this + *(uint *)(this + uVar3) + uVar3),4,
                                 (size_t *)0x0);
              if (!bVar1) {
                return false;
              }
              lVar2 = -(long)*(int *)this;
            }
            if ((*(ushort *)(this + lVar2) < 0xf) ||
               (uVar3 = (ulong)*(ushort *)(this + lVar2 + 0xe), uVar3 == 0)) {
              vec_01 = (Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int> *)0x0;
            }
            else {
              vec_01 = (Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int> *)
                       (this + *(uint *)(this + uVar3) + uVar3);
            }
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::Service>
                              (verifier,vec_01);
            if (((bVar1) &&
                (bVar1 = flatbuffers::Table::VerifyField<unsigned_long>
                                   (&this->super_Table,verifier,0x10,8), bVar1)) &&
               (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                  (&this->super_Table,verifier,0x12), bVar1)) {
              lVar2 = -(long)*(int *)this;
              if ((0x12 < *(ushort *)(this + -(long)*(int *)this)) &&
                 (uVar3 = (ulong)*(ushort *)(this + lVar2 + 0x12), uVar3 != 0)) {
                bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                  (verifier,(uint8_t *)(this + *(uint *)(this + uVar3) + uVar3),4,
                                   (size_t *)0x0);
                if (!bVar1) {
                  return false;
                }
                lVar2 = -(long)*(int *)this;
              }
              if ((*(ushort *)(this + lVar2) < 0x13) ||
                 (uVar3 = (ulong)*(ushort *)(this + lVar2 + 0x12), uVar3 == 0)) {
                vec_02 = (Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *)0x0;
              }
              else {
                vec_02 = (Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *)
                         (this + *(uint *)(this + uVar3) + uVar3);
              }
              bVar1 = flatbuffers::VerifierTemplate<false>::
                      VerifyVectorOfTables<reflection::SchemaFile>(verifier,vec_02);
              if (bVar1) {
                verifier->depth_ = verifier->depth_ - 1;
                return true;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_OBJECTS) &&
           verifier.VerifyVector(objects()) &&
           verifier.VerifyVectorOfTables(objects()) &&
           VerifyOffsetRequired(verifier, VT_ENUMS) &&
           verifier.VerifyVector(enums()) &&
           verifier.VerifyVectorOfTables(enums()) &&
           VerifyOffset(verifier, VT_FILE_IDENT) &&
           verifier.VerifyString(file_ident()) &&
           VerifyOffset(verifier, VT_FILE_EXT) &&
           verifier.VerifyString(file_ext()) &&
           VerifyOffset(verifier, VT_ROOT_TABLE) &&
           verifier.VerifyTable(root_table()) &&
           VerifyOffset(verifier, VT_SERVICES) &&
           verifier.VerifyVector(services()) &&
           verifier.VerifyVectorOfTables(services()) &&
           VerifyField<uint64_t>(verifier, VT_ADVANCED_FEATURES, 8) &&
           VerifyOffset(verifier, VT_FBS_FILES) &&
           verifier.VerifyVector(fbs_files()) &&
           verifier.VerifyVectorOfTables(fbs_files()) &&
           verifier.EndTable();
  }